

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O2

void telnet_ttype_is(telnet_t *telnet,char *ttype)

{
  size_t size;
  
  if (ttype == (char *)0x0) {
    ttype = "NVT";
  }
  _send(telnet,(char *)telnet_ttype_is::IS,4);
  size = strlen(ttype);
  _send(telnet,ttype,size);
  telnet_iac(telnet,0xf0);
  return;
}

Assistant:

void telnet_ttype_is(telnet_t *telnet, const char* ttype) {
	static const unsigned char IS[] = { TELNET_IAC, TELNET_SB,
			TELNET_TELOPT_TTYPE, TELNET_TTYPE_IS };
	if (!ttype) {
		ttype = "NVT";
	}
	_sendu(telnet, IS, sizeof(IS));
	_send(telnet, ttype, strlen(ttype));
	telnet_finish_sb(telnet);
}